

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

CompressedIDManifest * __thiscall
Imf_3_4::CompressedIDManifest::operator=(CompressedIDManifest *this,CompressedIDManifest *other)

{
  uchar *puVar1;
  CompressedIDManifest *in_RSI;
  CompressedIDManifest *in_RDI;
  
  if (in_RDI != in_RSI) {
    if (in_RDI->_data != (uchar *)0x0) {
      free(in_RDI->_data);
    }
    puVar1 = (uchar *)malloc((long)in_RSI->_compressedDataSize);
    in_RDI->_data = puVar1;
    in_RDI->_compressedDataSize = in_RSI->_compressedDataSize;
    in_RDI->_uncompressedDataSize = in_RSI->_uncompressedDataSize;
    memcpy(in_RDI->_data,in_RSI->_data,(long)in_RDI->_compressedDataSize);
  }
  return in_RDI;
}

Assistant:

CompressedIDManifest&
CompressedIDManifest::operator= (const CompressedIDManifest& other)
{
    if (this != &other)
    {
        if (_data) { free (_data); }
        _data = (unsigned char*) malloc (other._compressedDataSize);
        _compressedDataSize   = other._compressedDataSize;
        _uncompressedDataSize = other._uncompressedDataSize;
        memcpy (_data, other._data, _compressedDataSize);
    }
    return *this;
}